

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O1

bool __thiscall
MetricsDiscovery::MDHelper::InitMetricsDiscovery
          (MDHelper *this,string *metricsLibraryName,string *metricSetSymbolName,
          string *metricsFileName,uint32_t adapterIndex,bool includeMaxValues)

{
  bool bVar1;
  long lVar2;
  OpenAdapterGroup_fn p_Var3;
  OpenMetricsDevice_fn p_Var4;
  OpenMetricsDeviceFromFile_fn p_Var5;
  CloseMetricsDevice_fn p_Var6;
  char *pcVar7;
  undefined7 *local_50;
  undefined8 local_48;
  undefined7 local_40;
  undefined4 uStack_39;
  undefined1 local_35;
  
  this->m_Initialized = false;
  this->m_IncludeMaxValues = includeMaxValues;
  this->OpenAdapterGroup = (OpenAdapterGroup_fn)0x0;
  this->OpenMetricsDevice = (OpenMetricsDevice_fn)0x0;
  this->OpenMetricsDeviceFromFile = (OpenMetricsDeviceFromFile_fn)0x0;
  this->CloseMetricsDevice = (CloseMetricsDevice_fn)0x0;
  if ((this->m_APIMask != 1 & (byte)this->m_APIMask) != 0) {
    return false;
  }
  if (metricsLibraryName->_M_string_length == 0) {
    lVar2 = dlopen("libigdmd.so",1);
    if (lVar2 == 0) {
      local_40 = 0x6d64676962696c;
      uStack_39 = 0x6f732e64;
      local_48 = 0xb;
      local_35 = 0;
      local_50 = &local_40;
      std::__cxx11::string::append((char *)&local_50);
      lVar2 = dlopen(local_50,1);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
    }
    if (lVar2 != 0) goto LAB_0019b849;
    pcVar7 = "libmd.so";
  }
  else {
    pcVar7 = (metricsLibraryName->_M_dataplus)._M_p;
  }
  lVar2 = dlopen(pcVar7,1);
LAB_0019b849:
  if (lVar2 != 0) {
    p_Var3 = (OpenAdapterGroup_fn)dlsym(lVar2,"OpenAdapterGroup");
    this->OpenAdapterGroup = p_Var3;
    p_Var4 = (OpenMetricsDevice_fn)dlsym(lVar2,"OpenMetricsDevice");
    this->OpenMetricsDevice = p_Var4;
    if (p_Var4 != (OpenMetricsDevice_fn)0x0) {
      p_Var5 = (OpenMetricsDeviceFromFile_fn)dlsym(lVar2,"OpenMetricsDeviceFromFile");
      this->OpenMetricsDeviceFromFile = p_Var5;
      if (p_Var5 != (OpenMetricsDeviceFromFile_fn)0x0) {
        p_Var6 = (CloseMetricsDevice_fn)dlsym(lVar2,"CloseMetricsDevice");
        this->CloseMetricsDevice = p_Var6;
        if (p_Var6 != (CloseMetricsDevice_fn)0x0) {
          bVar1 = InitMetricsDiscoveryAdapterGroup
                            (this,metricSetSymbolName,metricsFileName,adapterIndex);
          if (!bVar1) {
            bVar1 = InitMetricsDiscoveryLegacy(this,metricSetSymbolName,metricsFileName);
          }
          if (bVar1 != false) {
            (**(code **)(*(long *)this->m_MetricSet + 0x48))(this->m_MetricSet,this->m_APIMask);
            this->m_Initialized = true;
          }
          return this->m_Initialized;
        }
      }
    }
  }
  return false;
}

Assistant:

bool MDHelper::InitMetricsDiscovery(
    const std::string& metricsLibraryName,
    const std::string& metricSetSymbolName,
    const std::string& metricsFileName,
    uint32_t adapterIndex,
    bool includeMaxValues )
{
    m_Initialized = false;
    m_IncludeMaxValues = includeMaxValues;

    OpenAdapterGroup = NULL;
    OpenMetricsDevice = NULL;
    OpenMetricsDeviceFromFile = NULL;
    CloseMetricsDevice = NULL;

    if (m_APIMask & API_TYPE_IOSTREAM && m_APIMask != API_TYPE_IOSTREAM)
    {
        DebugPrint("API type IOSTREAM cannot be combined with any other API type.\n");
        return false;
    }

    // Open the MDAPI library from the passed-in file name if provided, or from
    // a default file name otherwise.
    void* pLibrary = OpenLibrary(metricsLibraryName);
    if (pLibrary == NULL)
    {
        DebugPrint("Couldn't load metrics discovery library!\n");
        return false;
    }

    OpenAdapterGroup = (OpenAdapterGroup_fn)GetFunctionAddress(pLibrary, "OpenAdapterGroup");
    if (OpenAdapterGroup == NULL)
    {
        DebugPrint("Couldn't get pointer to OpenAdapterGroup!\n");
        // OpenAdapterGroup is a newer function that is not supported by older MDAPI.
    }

    OpenMetricsDevice = (OpenMetricsDevice_fn)GetFunctionAddress(pLibrary, "OpenMetricsDevice");
    if (OpenMetricsDevice == NULL)
    {
        DebugPrint("Couldn't get pointer to OpenMetricsDevice!\n");
        return false;
    }

    OpenMetricsDeviceFromFile = (OpenMetricsDeviceFromFile_fn)GetFunctionAddress(pLibrary, "OpenMetricsDeviceFromFile");
    if (OpenMetricsDeviceFromFile == NULL)
    {
        DebugPrint("Couldn't get pointer to OpenMetricsDeviceFromFile!\n");
        return false;
    }

    CloseMetricsDevice = (CloseMetricsDevice_fn)GetFunctionAddress(pLibrary, "CloseMetricsDevice");
    if (CloseMetricsDevice == NULL)
    {
        DebugPrint("Couldn't get pointer to CloseMetricsDevice!\n");
        return false;
    }

    DebugPrint("InitMetricsDiscoveryAdapterGroup for adapter index %u...\n", adapterIndex);
    bool success = InitMetricsDiscoveryAdapterGroup(
        metricSetSymbolName,
        metricsFileName,
        adapterIndex );
    if (!success)
    {
        DebugPrint("InitMetricsDiscoveryLegacy...\n", adapterIndex);
        success = InitMetricsDiscoveryLegacy(
            metricSetSymbolName,
            metricsFileName );
    }

    if (success)
    {
        m_MetricSet->SetApiFiltering( m_APIMask );
        m_Initialized = true;
    }

    DebugPrint("MetricsDiscoveryInit End\n");
    return m_Initialized;
}